

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

JavascriptPromiseAnyRejectElementFunction * __thiscall
Js::JavascriptLibrary::CreatePromiseAnyRejectElementFunction
          (JavascriptLibrary *this,JavascriptMethod entryPoint,uint32 index,JavascriptArray *errors,
          JavascriptPromiseCapability *capabilities,
          JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper *remainingElements,
          JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper *alreadyCalledWrapper)

{
  DynamicType *type;
  Recycler *recycler;
  JavascriptPromiseAnyRejectElementFunction *this_00;
  undefined1 local_68 [8];
  TrackAllocData data;
  InfoBitsWrapper<(Memory::ObjectInfoBits)1> local_31;
  
  data._32_8_ = capabilities;
  type = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Function,
                          &((this->super_JavascriptLibraryBase).functionPrototype.ptr)->
                           super_RecyclableObject,entryPoint,
                          (DynamicTypeHandler *)
                          DeferredTypeHandler<&(bool_Js::JavascriptLibrary::InitializeFunction<false,false,false,false>(Js::DynamicObject*,Js::DeferredTypeHandlerBase*,Js::DeferredInitializeMode)),Js::InitializeFunctionDeferredTypeHandlerFilter<false,false,false>,false,(unsigned_short)0,(unsigned_short)0>
                          ::defaultInstance,false,false);
  local_68 = (undefined1  [8])&JavascriptPromiseAnyRejectElementFunction::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_74a5554;
  data.filename._0_4_ = 0x1a08;
  recycler = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_68);
  this_00 = (JavascriptPromiseAnyRejectElementFunction *)
            new<(Memory::ObjectInfoBits)1>(0x70,recycler,&local_31);
  JavascriptPromiseAnyRejectElementFunction::JavascriptPromiseAnyRejectElementFunction
            (this_00,type,(FunctionInfo *)JavascriptPromise::EntryInfo::AnyRejectElementFunction,
             index,errors,(JavascriptPromiseCapability *)data._32_8_,remainingElements,
             alreadyCalledWrapper);
  return this_00;
}

Assistant:

JavascriptPromiseAnyRejectElementFunction* JavascriptLibrary::CreatePromiseAnyRejectElementFunction(JavascriptMethod entryPoint, uint32 index, JavascriptArray* errors, JavascriptPromiseCapability* capabilities, JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper* remainingElements, JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper* alreadyCalledWrapper)
    {
        FunctionInfo* functionInfo = &Js::JavascriptPromise::EntryInfo::AnyRejectElementFunction;
        DynamicType* type = DynamicType::New(scriptContext, TypeIds_Function, functionPrototype, entryPoint, GetDeferredAnonymousFunctionTypeHandler());
        JavascriptPromiseAnyRejectElementFunction* function = RecyclerNewEnumClass(this->GetRecycler(), EnumFunctionClass, JavascriptPromiseAnyRejectElementFunction, type, functionInfo, index, errors, capabilities, remainingElements, alreadyCalledWrapper);
        // Length should be 1 but not accessible from script.
        return function;
    }